

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  Mat *this;
  reference pvVar1;
  char *pcVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_dequant;
  float bias0;
  float *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int w;
  float in_stack_fffffffffffffeb4;
  Mat *this_00;
  int local_128;
  int local_124;
  char *local_120;
  char *local_118;
  char *local_110;
  Mat local_108;
  char *local_c8;
  char *local_c0;
  value_type local_b4;
  float local_b0;
  Mat *local_a0;
  Mat local_98;
  int local_54;
  float *local_50;
  char *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  Mat *local_20;
  
  local_34 = *(int *)(in_RDI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x2c);
  local_3c = *(int *)(in_RSI + 0x30);
  local_40 = *(int *)(in_RSI + 0x34);
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; local_54 < local_40; local_54 = local_54 + 1) {
    this_00 = &local_98;
    Mat::channel(this_00,(int)in_stack_fffffffffffffeb4);
    this = (Mat *)Mat::operator_cast_to_float_(this_00);
    if (local_50 == (float *)0x0) {
      in_stack_fffffffffffffeb4 = 0.0;
    }
    else {
      in_stack_fffffffffffffeb4 = local_50[local_54];
    }
    local_b0 = in_stack_fffffffffffffeb4;
    local_a0 = this;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)local_54);
    local_b4 = *pvVar1;
    Mat::fill(this,(float)((ulong)this_00 >> 0x20));
    local_c0 = local_48 + local_54 * 9;
    Mat::channel(this_00,(int)in_stack_fffffffffffffeb4);
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_108);
    Mat::~Mat((Mat *)0x19d19a);
    local_118 = pcVar2 + local_34;
    local_120 = pcVar2 + (local_34 << 1);
    local_110 = pcVar2;
    for (local_124 = 0; local_124 < local_3c; local_124 = local_124 + 1) {
      for (local_128 = local_38; 0 < local_128; local_128 = local_128 + -1) {
        *(float *)&local_a0->data =
             (float)((int)local_120[2] * (int)local_c0[8] +
                    (int)local_120[1] * (int)local_c0[7] +
                    (int)*local_120 * (int)local_c0[6] +
                    (int)local_118[2] * (int)local_c0[5] +
                    (int)local_118[1] * (int)local_c0[4] +
                    (int)*local_118 * (int)local_c0[3] +
                    (int)local_110[2] * (int)local_c0[2] +
                    (int)local_110[1] * (int)local_c0[1] + (int)*local_110 * (int)*local_c0) *
             local_b4 + *(float *)&local_a0->data;
        local_110 = local_110 + 1;
        local_118 = local_118 + 1;
        local_120 = local_120 + 1;
        local_a0 = (Mat *)((long)&local_a0->data + 4);
      }
      local_110 = local_110 + 2;
      local_118 = local_118 + 2;
      local_120 = local_120 + 2;
    }
    local_c8 = pcVar2;
    Mat::~Mat((Mat *)0x19d411);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];    

        out.fill(bias0);    

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}